

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_resources.cpp
# Opt level: O0

bool dxil_spv::get_annotate_handle_meta(Impl *impl,CallInst *instruction,AnnotateHandleMeta *meta)

{
  CallInst *pCVar1;
  bool bVar2;
  uint uVar3;
  uint32_t uVar4;
  Value *pVVar5;
  ConstantAggregate *this;
  Constant *pCVar6;
  APInt *pAVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  pointer ppVar11;
  Value *local_80;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
  local_78;
  Value *local_70;
  _Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
  local_68;
  iterator itr;
  uint32_t binding_space;
  uint32_t binding_range_hi;
  uint32_t binding_range_lo;
  ConstantAggregate *res_type;
  mapped_type *local_40;
  mapped_type *annotation;
  uint32_t non_uniform_int;
  uint32_t opcode;
  CallInst *handle;
  AnnotateHandleMeta *meta_local;
  CallInst *instruction_local;
  Impl *impl_local;
  
  handle = (CallInst *)meta;
  meta_local = (AnnotateHandleMeta *)instruction;
  instruction_local = (CallInst *)impl;
  pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  _non_uniform_int = LLVMBC::dyn_cast<LLVMBC::CallInst>(pVVar5);
  if (_non_uniform_int == (CallInst *)0x0) {
    impl_local._7_1_ = false;
  }
  else {
    bVar2 = get_constant_operand
                      (&_non_uniform_int->super_Instruction,0,(uint32_t *)((long)&annotation + 4));
    if (bVar2) {
      *(undefined4 *)&(handle->super_Instruction).super_Value.type = annotation._4_4_;
      annotation._0_4_ = 0;
      if (*(int *)&(handle->super_Instruction).super_Value.type == 0xda) {
        res_type = (ConstantAggregate *)meta_local;
        local_40 = std::
                   unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::AnnotateHandleReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>_>
                   ::operator[]((unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::AnnotateHandleReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::AnnotateHandleReference>_>_>
                                 *)&instruction_local[0xd].super_Instruction.is_terminator,
                                (key_type *)&res_type);
        *(ResourceType *)((long)&(handle->super_Instruction).super_Value.type + 4) =
             local_40->resource_type;
        *(undefined4 *)&(handle->super_Instruction).super_Value.tween_id = 0xffffffff;
        pVVar5 = LLVMBC::Instruction::getOperand(&_non_uniform_int->super_Instruction,1);
        *(Value **)&(handle->super_Instruction).super_Value.kind = pVVar5;
        bVar2 = get_constant_operand(&_non_uniform_int->super_Instruction,3,(uint32_t *)&annotation)
        ;
        if (!bVar2) {
          return false;
        }
      }
      else if (*(int *)&(handle->super_Instruction).super_Value.type == 0xd9) {
        pVVar5 = LLVMBC::Instruction::getOperand(&_non_uniform_int->super_Instruction,2);
        *(Value **)&(handle->super_Instruction).super_Value.kind = pVVar5;
        bVar2 = get_constant_operand(&_non_uniform_int->super_Instruction,3,(uint32_t *)&annotation)
        ;
        if (!bVar2) {
          return false;
        }
        pVVar5 = LLVMBC::Instruction::getOperand(&_non_uniform_int->super_Instruction,1);
        this = LLVMBC::dyn_cast<LLVMBC::ConstantAggregate>(pVVar5);
        if (this == (ConstantAggregate *)0x0) {
          pVVar5 = LLVMBC::Instruction::getOperand(&_non_uniform_int->super_Instruction,1);
          bVar2 = LLVMBC::isa<LLVMBC::ConstantAggregateZero>(pVVar5);
          if (!bVar2) {
            return false;
          }
          *(undefined1 *)((long)&(handle->super_Instruction).super_Value.type + 4) = 0;
          uVar4 = Converter::Impl::find_binding_meta_index
                            ((Impl *)instruction_local,0,0,0,
                             *(ResourceType *)
                              ((long)&(handle->super_Instruction).super_Value.type + 4));
          *(uint32_t *)&(handle->super_Instruction).super_Value.tween_id = uVar4;
          if ((int)(handle->super_Instruction).super_Value.tween_id == -1) {
            return false;
          }
        }
        else {
          uVar3 = LLVMBC::ConstantAggregate::getNumOperands(this);
          if (uVar3 != 4) {
            return false;
          }
          pCVar6 = LLVMBC::ConstantAggregate::getOperand(this,0);
          pAVar7 = LLVMBC::Constant::getUniqueInteger(pCVar6);
          uVar8 = LLVMBC::APInt::getZExtValue(pAVar7);
          pCVar6 = LLVMBC::ConstantAggregate::getOperand(this,1);
          pAVar7 = LLVMBC::Constant::getUniqueInteger(pCVar6);
          uVar9 = LLVMBC::APInt::getZExtValue(pAVar7);
          pCVar6 = LLVMBC::ConstantAggregate::getOperand(this,2);
          pAVar7 = LLVMBC::Constant::getUniqueInteger(pCVar6);
          uVar10 = LLVMBC::APInt::getZExtValue(pAVar7);
          itr.
          super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
          ._M_cur._4_4_ = (uint32_t)uVar10;
          pCVar6 = LLVMBC::ConstantAggregate::getOperand(this,3);
          pAVar7 = LLVMBC::Constant::getUniqueInteger(pCVar6);
          uVar10 = LLVMBC::APInt::getZExtValue(pAVar7);
          *(char *)((long)&(handle->super_Instruction).super_Value.type + 4) = (char)uVar10;
          uVar4 = Converter::Impl::find_binding_meta_index
                            ((Impl *)instruction_local,(uint32_t)uVar8,(uint32_t)uVar9,
                             itr.
                             super__Node_iterator_base<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false>
                             ._M_cur._4_4_,
                             *(ResourceType *)
                              ((long)&(handle->super_Instruction).super_Value.type + 4));
          *(uint32_t *)&(handle->super_Instruction).super_Value.tween_id = uVar4;
          if ((int)(handle->super_Instruction).super_Value.tween_id == -1) {
            return false;
          }
        }
      }
      else {
        if (*(int *)&(handle->super_Instruction).super_Value.type != 0xa0) {
          return false;
        }
        pCVar1 = instruction_local + 0xb;
        local_70 = LLVMBC::Instruction::getOperand(&_non_uniform_int->super_Instruction,1);
        local_68._M_cur =
             (__node_type *)
             std::
             unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::ResourceMetaReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>_>
             ::find((unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::ResourceMetaReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>_>
                     *)&(pCVar1->super_Instruction).super_Value.kind,&local_70);
        local_78._M_cur =
             (__node_type *)
             std::
             unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::ResourceMetaReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>_>
             ::end((unordered_map<const_LLVMBC::Value_*,_dxil_spv::Converter::Impl::ResourceMetaReference,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>_>_>
                    *)&instruction_local[0xb].super_Instruction.super_Value.kind);
        bVar2 = std::__detail::operator==(&local_68,&local_78);
        if (bVar2) {
          return false;
        }
        pCVar1 = instruction_local + 0xd;
        local_80 = LLVMBC::Instruction::getOperand((Instruction *)meta_local,1);
        std::
        unordered_set<const_LLVMBC::Value_*,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Value_*>_>
        ::insert((unordered_set<const_LLVMBC::Value_*,_std::hash<const_LLVMBC::Value_*>,_std::equal_to<const_LLVMBC::Value_*>,_dxil_spv::ThreadLocalAllocator<const_LLVMBC::Value_*>_>
                  *)&(pCVar1->super_Instruction).attachments._M_h._M_element_count,&local_80);
        ppVar11 = std::__detail::
                  _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
                  ::operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
                                *)&local_68);
        *(ResourceType *)((long)&(handle->super_Instruction).super_Value.type + 4) =
             (ppVar11->second).type;
        ppVar11 = std::__detail::
                  _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
                  ::operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
                                *)&local_68);
        *(uint *)&(handle->super_Instruction).super_Value.tween_id = (ppVar11->second).meta_index;
        ppVar11 = std::__detail::
                  _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
                  ::operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
                                *)&local_68);
        *(Value **)&(handle->super_Instruction).super_Value.kind = (ppVar11->second).offset;
        ppVar11 = std::__detail::
                  _Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
                  ::operator->((_Node_iterator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::ResourceMetaReference>,_false,_false>
                                *)&local_68);
        annotation._0_4_ = (uint)((ppVar11->second).non_uniform & 1);
      }
      *(bool *)((long)&(handle->super_Instruction).super_Value.tween_id + 4) = (uint)annotation != 0
      ;
      impl_local._7_1_ = true;
    }
    else {
      impl_local._7_1_ = false;
    }
  }
  return impl_local._7_1_;
}

Assistant:

bool get_annotate_handle_meta(Converter::Impl &impl, const llvm::CallInst *instruction,
                              AnnotateHandleMeta &meta)
{
	auto *handle = llvm::dyn_cast<llvm::CallInst>(instruction->getOperand(1));
	if (!handle)
		return false;

	uint32_t opcode;
	if (!get_constant_operand(handle, 0, &opcode))
		return false;

	meta.resource_op = DXIL::Op(opcode);
	uint32_t non_uniform_int = 0;

	if (meta.resource_op == DXIL::Op::CreateHandleFromHeap)
	{
		auto &annotation = impl.llvm_annotate_handle_uses[instruction];
		meta.resource_type = annotation.resource_type;
		meta.binding_index = UINT32_MAX; // Direct heap access.

		meta.offset = handle->getOperand(1);

		if (!get_constant_operand(handle, 3, &non_uniform_int))
			return false;
	}
	else if (meta.resource_op == DXIL::Op::CreateHandleFromBinding)
	{
		meta.offset = handle->getOperand(2);

		if (!get_constant_operand(handle, 3, &non_uniform_int))
			return false;

		if (auto *res_type = llvm::dyn_cast<llvm::ConstantAggregate>(handle->getOperand(1)))
		{
			if (res_type->getNumOperands() != 4)
				return false;

			uint32_t binding_range_lo = res_type->getOperand(0)->getUniqueInteger().getZExtValue();
			uint32_t binding_range_hi = res_type->getOperand(1)->getUniqueInteger().getZExtValue();
			uint32_t binding_space = res_type->getOperand(2)->getUniqueInteger().getZExtValue();
			meta.resource_type = DXIL::ResourceType(res_type->getOperand(3)->getUniqueInteger().getZExtValue());
			meta.binding_index = impl.find_binding_meta_index(
				binding_range_lo, binding_range_hi,
				binding_space, meta.resource_type);

			if (meta.binding_index == UINT32_MAX)
				return false;
		}
		else if (llvm::isa<llvm::ConstantAggregateZero>(handle->getOperand(1)))
		{
			meta.resource_type = DXIL::ResourceType(0);
			meta.binding_index = impl.find_binding_meta_index(0, 0, 0, meta.resource_type);
			if (meta.binding_index == UINT32_MAX)
				return false;
		}
		else
			return false;
	}
	else if (meta.resource_op == DXIL::Op::CreateHandleForLib)
	{
		auto itr = impl.llvm_global_variable_to_resource_mapping.find(handle->getOperand(1));
		if (itr == impl.llvm_global_variable_to_resource_mapping.end())
			return false;

		// Marks that the CreateHandleForLib is a dummy and should not actually emit a resource handle.
		impl.llvm_annotate_handle_lib_uses.insert(instruction->getOperand(1));

		meta.resource_type = itr->second.type;
		meta.binding_index = itr->second.meta_index;
		meta.offset = itr->second.offset;
		non_uniform_int = uint32_t(itr->second.non_uniform);
	}
	else
		return false;

	meta.non_uniform = non_uniform_int != 0;
	return true;
}